

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_loader.c
# Opt level: O3

void image_load(char *filename,uchar *image_data,int *image_width,int *image_height)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  list *plVar3;
  long lVar4;
  char magic [4];
  undefined4 local_3c;
  int *local_38;
  
  local_38 = image_height;
  if (filename != (char *)0x0) {
    __stream = fopen(filename,"r");
    if (__stream == (FILE *)0x0) {
      printf("fopen %s failed\n",filename);
    }
    else {
      local_3c = 0;
      sVar2 = fread(&local_3c,4,1,__stream);
      if (sVar2 == 1) {
        fclose(__stream);
        plVar3 = &loader_list;
        do {
          plVar3 = plVar3->next;
          if (plVar3 == &loader_list) goto LAB_0010c7a0;
          iVar1 = bcmp(&local_3c,plVar3[-3].prev,(long)*(int *)&plVar3[-2].next);
        } while (iVar1 != 0);
        lVar4 = (*(code *)plVar3[-2].prev)(filename,image_width,local_38);
        if (lVar4 != 0) {
          if (image_data != (uchar *)0x0) {
            (*(code *)plVar3[-1].next)(lVar4,image_data);
          }
          (*(code *)plVar3[-1].prev)(lVar4);
          return;
        }
      }
      else {
        puts("fread failed");
      }
    }
  }
LAB_0010c7a0:
  *image_width = 0x200;
  *local_38 = 0x200;
  if (image_data != (uchar *)0x0) {
    memcpy(image_data,tux_image.pixel_data,0x100000);
    return;
  }
  return;
}

Assistant:

void image_load(char *filename, unsigned char *image_data, int *image_width, int *image_height)
{
  char magic[4];
  loader_t *loader = NULL;
  struct list *loader_entry = NULL;

  if (filename) {
    if (magic_read(filename, magic, sizeof(magic)) != -1) {
      LIST_FOR_EACH(loader_entry, &loader_list) {
        loader = LIST_ENTRY(loader_entry, loader_t, entry);
        if (!memcmp(magic, loader->magic, loader->magic_size)) {
          break;
        }
        loader = NULL;
      }
    }

    if (loader) {
      if (image_read(filename, loader, image_data, image_width, image_height) == -1) {
        loader = NULL;
      }
    }
  }

  if (!loader) {
    *image_width = tux_image.width;
    *image_height = tux_image.height;
    if (image_data) {
      memcpy(image_data, (unsigned char *)tux_image.pixel_data, tux_image.width * tux_image.height * 4);
    }
  }
}